

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

Gia_Man_t * Gia_ManMuxRestructure(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Bit_t *p_00;
  int *__s;
  Gia_Man_t *p_01;
  char *pcVar5;
  uint *puVar6;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGVar7;
  int Entry;
  int Entry_00;
  int Entry_01;
  long lVar8;
  int iVar9;
  size_t __size;
  Gia_Obj_t *pObj_00;
  
  iVar9 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  p_00 = (Vec_Bit_t *)malloc(0x10);
  p_00->nCap = iVar9 * 0x20;
  if (iVar9 == 0) {
    __size = 0;
    __s = (int *)0x0;
  }
  else {
    __size = (long)iVar9 << 2;
    __s = (int *)malloc(__size);
  }
  p_00->pArray = __s;
  p_00->nSize = iVar9 * 0x20;
  memset(__s,0,__size);
  if (p->pSibls != (int *)0x0) {
    __assert_fail("!Gia_ManHasChoices(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0xee,"Gia_Man_t *Gia_ManMuxRestructure(Gia_Man_t *)");
  }
  if (p->vMapping != (Vec_Int_t *)0x0) {
    __assert_fail("!Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0xef,"Gia_Man_t *Gia_ManMuxRestructure(Gia_Man_t *)");
  }
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0xf0,"Gia_Man_t *Gia_ManMuxRestructure(Gia_Man_t *)");
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  p_01 = Gia_ManStart(p->nObjs);
  pcVar5 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar5;
  puVar6 = (uint *)calloc((long)p_01->nObjsAlloc,4);
  p_01->pMuxes = puVar6;
  p->pObjs->Value = 0;
  Gia_ManHashStart(p_01);
  for (lVar8 = 1; lVar8 < p->nObjs; lVar8 = lVar8 + 1) {
    iVar9 = (int)lVar8;
    pObj = Gia_ManObj(p,iVar9);
    if (pObj == (Gia_Obj_t *)0x0) break;
    uVar1 = (uint)*(undefined8 *)pObj;
    if ((~uVar1 & 0x9fffffff) == 0) {
      uVar1 = Gia_ManAppendCi(p_01);
LAB_001fc4f1:
      pObj->Value = uVar1;
    }
    else {
      if ((~uVar1 & 0x1fffffff) != 0 && (int)uVar1 < 0) {
        iVar9 = Gia_ObjFanin0Copy(pObj);
        uVar1 = Gia_ManAppendCo(p_01,iVar9);
        goto LAB_001fc4f1;
      }
      iVar2 = Gia_ObjIsBuf(pObj);
      if (iVar2 != 0) {
        iVar9 = Gia_ObjFanin0Copy(pObj);
        uVar1 = Gia_ManAppendBuf(p_01,iVar9);
        goto LAB_001fc4f1;
      }
      puVar6 = p->pMuxes;
      if (puVar6 == (uint *)0x0) {
LAB_001fc6e2:
        iVar9 = Gia_ObjIsXor(pObj);
        iVar2 = Gia_ObjFanin0Copy(pObj);
        iVar3 = Gia_ObjFanin1Copy(pObj);
        if (iVar9 == 0) {
          uVar1 = Gia_ManHashAnd(p_01,iVar2,iVar3);
        }
        else {
          uVar1 = Gia_ManHashXor(p_01,iVar2,iVar3);
        }
        goto LAB_001fc4f1;
      }
      if ((puVar6[lVar8] == 0) ||
         (*(int *)((long)puVar6 + (lVar8 * 4 - (ulong)((uVar1 & 0x1fffffff) * 4))) == 0)) {
LAB_001fc540:
        if ((p->pMuxes != (uint *)0x0) && (p->pMuxes[lVar8] != 0)) {
          iVar9 = Gia_ObjFanin2Copy(p,pObj);
          iVar2 = Gia_ObjFanin1Copy(pObj);
          iVar3 = Gia_ObjFanin0Copy(pObj);
          uVar1 = Gia_ManHashMux(p_01,iVar9,iVar2,iVar3);
          goto LAB_001fc4f1;
        }
        goto LAB_001fc6e2;
      }
      iVar2 = Vec_BitEntry(p_00,iVar9 - (uVar1 & 0x1fffffff));
      if (iVar2 != 0) goto LAB_001fc540;
      if (p->pMuxes == (uint *)0x0) goto LAB_001fc6e2;
      uVar1 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
      if (*(int *)((long)p->pMuxes + (lVar8 * 4 - (ulong)((uVar1 & 0x1fffffff) << 2))) == 0)
      goto LAB_001fc540;
      iVar2 = Vec_BitEntry(p_00,iVar9 - (uVar1 & 0x1fffffff));
      if (iVar2 != 0) goto LAB_001fc540;
      iVar2 = Gia_ObjFaninId2(p,iVar9 - (*(uint *)pObj & 0x1fffffff));
      iVar3 = Gia_ObjFaninId2(p,iVar9 - (*(uint *)&pObj->field_0x4 & 0x1fffffff));
      if (iVar2 != iVar3) goto LAB_001fc540;
      pObj_00 = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
      iVar2 = Gia_ObjFanin2Copy(p,pObj);
      iVar3 = Gia_ObjFanin2Copy(p,pObj_00);
      iVar4 = Gia_ObjFanin0Copy(pObj);
      iVar2 = Gia_ManHashMux(p_01,iVar2,iVar3,iVar4);
      iVar3 = Gia_ObjFanin1Copy(pObj_00);
      iVar4 = Gia_ObjFanin0Copy(pObj_00);
      iVar3 = Gia_ManHashMux(p_01,iVar2,iVar3,iVar4);
      iVar4 = Gia_ObjFanin2Copy(p,pObj);
      uVar1 = Gia_ManHashMux(p_01,iVar4,iVar3,iVar2);
      pObj->Value = uVar1;
      Vec_BitWriteEntry(p_00,iVar9 - (*(uint *)pObj & 0x1fffffff),Entry);
      Vec_BitWriteEntry(p_00,iVar9 - (*(uint *)&pObj->field_0x4 & 0x1fffffff),Entry_00);
      Vec_BitWriteEntry(p_00,iVar9,Entry_01);
    }
  }
  free(__s);
  free(p_00);
  Gia_ManHashStop(p_01);
  Gia_ManSetRegNum(p_01,p->nRegs);
  pGVar7 = Gia_ManCleanup(p_01);
  Gia_ManStop(p_01);
  return pGVar7;
}

Assistant:

Gia_Man_t * Gia_ManMuxRestructure( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, nNodes = 0;
    Vec_Bit_t * vUsed = Vec_BitStart( Gia_ManObjNum(p) );
    assert( !Gia_ManHasChoices(p) );
    assert( !Gia_ManHasMapping(p) );
    assert( p->pMuxes != NULL );
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p ); 
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashStart( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsMuxId(p, i) && 
                  Gia_ObjIsMuxId(p, Gia_ObjFaninId0(pObj, i)) && !Vec_BitEntry(vUsed, Gia_ObjFaninId0(pObj, i)) && 
                  Gia_ObjIsMuxId(p, Gia_ObjFaninId1(pObj, i)) && !Vec_BitEntry(vUsed, Gia_ObjFaninId1(pObj, i)) &&
                  Gia_ObjFaninId2(p, Gia_ObjFaninId0(pObj, i)) == Gia_ObjFaninId2(p, Gia_ObjFaninId1(pObj, i))  )
        {
            Gia_Obj_t * pFan1 = Gia_ObjFanin1(pObj);
            int Value0 = Gia_ManHashMux( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin2Copy(p, pFan1), Gia_ObjFanin0Copy(pObj) );
            int Value1 = Gia_ManHashMux( pNew, Value0, Gia_ObjFanin1Copy(pFan1), Gia_ObjFanin0Copy(pFan1) );
            pObj->Value = Gia_ManHashMux( pNew, Gia_ObjFanin2Copy(p, pObj), Value1, Value0 );
            Vec_BitWriteEntry( vUsed, Gia_ObjFaninId0(pObj, i), 1 );
            Vec_BitWriteEntry( vUsed, Gia_ObjFaninId1(pObj, i), 1 );
            Vec_BitWriteEntry( vUsed, i, 1 );
            nNodes++;
        }
        else if ( Gia_ObjIsMuxId(p, i) )
            pObj->Value = Gia_ManHashMux( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManHashXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else 
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    }
    Vec_BitFree( vUsed );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}